

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

int __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)'\x00'>::init
          (RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)__x00_>
           *this,EVP_PKEY_CTX *ctx)

{
  size_t __n;
  void *__s;
  ulong uVar1;
  XPMP2Error *this_00;
  
  __n = DAT_002cc788;
  __s = this->pMsg;
  if (__s == (void *)0x0) {
    __s = malloc(DAT_002cc788);
    this->pMsg = __s;
    if (__s == (void *)0x0) {
      this_00 = (XPMP2Error *)__cxa_allocate_exception(0x78);
      XPMP2Error::XPMP2Error
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
                 ,0x1b7,"init","ASSERT FAILED: %s","pMsg");
      __cxa_throw(this_00,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
    }
  }
  this->elemCount = 0;
  memset(__s,0,__n);
  uVar1 = (ulong)((DAT_002cc7c8 & 0xff) << 0x10) | 4;
  *(ulong *)this->pMsg = uVar1;
  this->size = 8;
  return (int)uVar1;
}

Assistant:

void RmtMsgBufTy<ElemTy,MsgTy,msgVer>::init ()
{
    // if buffer does not exist: create it
    if (!pMsg) {
        pMsg = malloc(glob.remoteBufSize);
        LOG_ASSERT(pMsg);
    }
    // initialize the buffer to an empty msg
    elemCount = 0;
    std::memset(pMsg, 0, glob.remoteBufSize);
    // overwrite with a standard initialized message, will set msg type, for example
    *reinterpret_cast<RemoteMsgBaseTy*>(pMsg) = RemoteMsgBaseTy(MsgTy,msgVer);
    size = sizeof(RemoteMsgBaseTy);     // msg hdr is defined
}